

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask12_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint uVar4;
  long in_RAX;
  long unaff_RBX;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x54483c34281c1408));
  vpmovsxbd_avx2(ZEXT816(0x5044383024181004));
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + in_RAX));
  auVar9 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBX));
  auVar9 = vpsllvd_avx2(auVar9,_DAT_00195d00);
  auVar3 = vpsllvd_avx2(auVar8,_DAT_00195d40);
  auVar7 = vpinsrd_avx(ZEXT416(*in),auVar8._0_4_ >> 8 | in[3] << 4,1);
  vpmovsxbd_avx(ZEXT416(0x7c74685c));
  uVar1 = in[0x1b];
  auVar2 = vpinsrd_avx(ZEXT416(auVar8._12_4_ >> 8 | in[0xb] << 4),auVar8._16_4_ >> 4,1);
  auVar2 = vpinsrd_avx(auVar2,in[0x10],2);
  auVar7 = vpinsrd_avx(auVar7,auVar8._4_4_ >> 4,2);
  auVar7 = vpinsrd_avx(auVar7,in[8],3);
  uVar4 = auVar8._28_4_ >> 4;
  auVar2 = vpinsrd_avx(auVar2,auVar8._24_4_ >> 8 | in[0x13] << 4,3);
  auVar8._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar7;
  auVar8._16_16_ = ZEXT116(1) * auVar2;
  auVar9 = vpternlogd_avx512vl(auVar3,auVar9,auVar8,0xfe);
  *(undefined1 (*) [32])out = auVar9;
  auVar5 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar4));
  vpmovsxbd_avx(ZEXT416(0x78706458));
  auVar2 = vpsllvd_avx2(auVar5,_DAT_001994c0);
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar4));
  auVar7 = vpinsrd_avx(ZEXT416(uVar4),in[0x18],1);
  auVar6 = vpsllvd_avx2(auVar6,_DAT_001994a0);
  auVar7 = vpinsrd_avx(auVar7,auVar5._4_4_ >> 8 | uVar1 << 4,2);
  auVar7 = vpinsrd_avx(auVar7,auVar5._8_4_ >> 4,3);
  auVar7 = vpternlogd_avx512vl(auVar2,auVar6,auVar7,0xfe);
  *(undefined1 (*) [16])(out + 8) = auVar7;
  return out + 0xc;
}

Assistant:

uint32_t *__fastpackwithoutmask12_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;

  return out;
}